

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::SPxFastRT<double>::minSelect
          (SPxFastRT<double> *this,double *val,double *stab,double *bestDelta,double max)

{
  SPxSolverBase<double> *pSVar1;
  int iVar2;
  double *pdVar3;
  double best;
  
  pdVar3 = (double *)infinity();
  best = *pdVar3;
  *bestDelta = 0.0;
  pSVar1 = (this->super_SPxRatioTester<double>).thesolver;
  iVar2 = minSelect(this,val,stab,&best,bestDelta,max,pSVar1->theFvec,&pSVar1->theLBbound,
                    &pSVar1->theUBbound,0,1);
  return iVar2;
}

Assistant:

int SPxFastRT<R>::minSelect(
   R& val,
   R& stab,
   R& bestDelta,
   R max)
{
   R best = R(infinity);
   bestDelta = 0.0;
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   return minSelect(val, stab, best, bestDelta, max,
                    this->thesolver->fVec(), this->thesolver->lbBound(), this->thesolver->ubBound(), 0, 1);
}